

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_koblitz(mbedtls_mpi *N,mbedtls_mpi_uint *Rp,size_t p_limbs,size_t adjust,size_t shift,
                   mbedtls_mpi_uint mask)

{
  undefined1 local_b8 [8];
  mbedtls_mpi_uint Mp [6];
  undefined1 local_80 [8];
  mbedtls_mpi R;
  mbedtls_mpi M;
  size_t i;
  int ret;
  mbedtls_mpi_uint mask_local;
  size_t shift_local;
  size_t adjust_local;
  size_t p_limbs_local;
  mbedtls_mpi_uint *Rp_local;
  mbedtls_mpi *N_local;
  
  if (N->n < p_limbs) {
    N_local._4_4_ = 0;
  }
  else {
    local_80._0_4_ = 1;
    R.s = 1;
    R._4_4_ = 0;
    R.p._0_4_ = 1;
    M._0_8_ = N->n - (p_limbs - adjust);
    if (p_limbs + adjust < (ulong)M._0_8_) {
      M._0_8_ = p_limbs + adjust;
    }
    R.n = (size_t)Rp;
    memset(local_b8,0,0x30);
    memcpy(local_b8,N->p + (p_limbs - adjust),M._0_8_ << 3);
    if ((shift == 0) || (i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&R.p,shift), i._4_4_ == 0)) {
      M.p = (mbedtls_mpi_uint *)p_limbs;
      if (mask != 0) {
        N->p[p_limbs - 1] = mask & N->p[p_limbs - 1];
      }
      for (; M.p < (mbedtls_mpi_uint *)N->n; M.p = (mbedtls_mpi_uint *)((long)M.p + 1)) {
        N->p[(long)M.p] = 0;
      }
      i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&R.p,(mbedtls_mpi *)&R.p,(mbedtls_mpi *)local_80)
      ;
      if ((i._4_4_ == 0) && (i._4_4_ = mbedtls_mpi_add_abs(N,N,(mbedtls_mpi *)&R.p), i._4_4_ == 0))
      {
        M._0_8_ = N->n - (p_limbs - adjust);
        if (p_limbs + adjust < (ulong)M._0_8_) {
          M._0_8_ = p_limbs + adjust;
        }
        memset(local_b8,0,0x30);
        memcpy(local_b8,N->p + (p_limbs - adjust),M._0_8_ << 3);
        if ((shift == 0) || (i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&R.p,shift), i._4_4_ == 0)
           ) {
          M.p = (mbedtls_mpi_uint *)p_limbs;
          if (mask != 0) {
            N->p[p_limbs - 1] = mask & N->p[p_limbs - 1];
          }
          for (; M.p < (mbedtls_mpi_uint *)N->n; M.p = (mbedtls_mpi_uint *)((long)M.p + 1)) {
            N->p[(long)M.p] = 0;
          }
          i._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)&R.p,(mbedtls_mpi *)&R.p,
                                        (mbedtls_mpi *)local_80);
          if (i._4_4_ == 0) {
            i._4_4_ = mbedtls_mpi_add_abs(N,N,(mbedtls_mpi *)&R.p);
          }
        }
      }
    }
    N_local._4_4_ = i._4_4_;
  }
  return N_local._4_4_;
}

Assistant:

static inline int ecp_mod_koblitz( mbedtls_mpi *N, mbedtls_mpi_uint *Rp, size_t p_limbs,
                                   size_t adjust, size_t shift, mbedtls_mpi_uint mask )
{
    int ret;
    size_t i;
    mbedtls_mpi M, R;
    mbedtls_mpi_uint Mp[P_KOBLITZ_MAX + P_KOBLITZ_R + 1];

    if( N->n < p_limbs )
        return( 0 );

    /* Init R */
    R.s = 1;
    R.p = Rp;
    R.n = P_KOBLITZ_R;

    /* Common setup for M */
    M.s = 1;
    M.p = Mp;

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

    /* Second pass */

    /* M = A1 */
    M.n = N->n - ( p_limbs - adjust );
    if( M.n > p_limbs + adjust )
        M.n = p_limbs + adjust;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + p_limbs - adjust, M.n * sizeof( mbedtls_mpi_uint ) );
    if( shift != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, shift ) );
    M.n += R.n; /* Make room for multiplication by R */

    /* N = A0 */
    if( mask != 0 )
        N->p[p_limbs - 1] &= mask;
    for( i = p_limbs; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + R * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &M, &M, &R ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}